

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Vector<unsigned_int,_2>
gl4cts::Math::greaterThanEqual<2>(Vector<double,_2> *left,Vector<double,_2> *right)

{
  Vector<unsigned_int,_2> *result;
  
  *(ulong *)result->m_data =
       CONCAT44(-(uint)(right->m_data[1] <= left->m_data[1]),
                -(uint)(right->m_data[0] <= left->m_data[0])) & 0x100000001;
  return (Vector<unsigned_int,_2>)result;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThanEqual(const tcu::Vector<glw::GLdouble, Size>& left,
													   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThanEqual(left, right));
}